

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O0

void normalizationCorrectionsLineFn
               (void *context,char *(*fields) [2],int32_t fieldCount,UErrorCode *pErrorCode)

{
  FILE *__stream;
  ulong uVar1;
  char *pcVar2;
  byte local_e8;
  byte local_e7;
  byte local_e4;
  byte local_e3;
  UVersionInfo thisVersion;
  UVersionInfo version;
  int32_t length;
  uint32_t code;
  char *s;
  char *end;
  uint32_t mapping [40];
  UErrorCode *pErrorCode_local;
  int32_t fieldCount_local;
  char *(*fields_local) [2];
  void *context_local;
  
  mapping._152_8_ = pErrorCode;
  uVar1 = strtoul((*fields)[0],&s,0x10);
  if (0 < *(int *)mapping._152_8_) {
    fprintf(_stderr,"gensprep: error parsing NormalizationCorrections.txt mapping at %s\n",
            (*fields)[0]);
    exit(*(int *)mapping._152_8_);
  }
  thisVersion = (UVersionInfo)
                u_parseCodePoints(fields[1][0],(uint32_t *)&end,0x28,(UErrorCode *)mapping._152_8_);
  u_versionFromString_63(&local_e4,fields[3][0]);
  u_versionFromString_63(&local_e8,"3.2.0");
  __stream = _stderr;
  if (0 < *(int *)mapping._152_8_) {
    pcVar2 = u_errorName_63(*(UErrorCode *)mapping._152_8_);
    fprintf(__stream,"gensprep error parsing NormalizationCorrections.txt of U+%04lx - %s\n",
            uVar1 & 0xffffffff,pcVar2);
    exit(*(int *)mapping._152_8_);
  }
  if ((local_e8 < local_e4) || ((local_e4 == local_e8 && (local_e7 < local_e3)))) {
    storeMapping((uint32_t)uVar1,(uint32_t *)&end,(int32_t)thisVersion,USPREP_MAP,
                 (UErrorCode *)mapping._152_8_);
  }
  setUnicodeVersionNC(&local_e4);
  return;
}

Assistant:

static void U_CALLCONV
normalizationCorrectionsLineFn(void *context,
                    char *fields[][2], int32_t fieldCount,
                    UErrorCode *pErrorCode) {
    uint32_t mapping[40];
    char *end, *s;
    uint32_t code;
    int32_t length;
    UVersionInfo version;
    UVersionInfo thisVersion;

    /* get the character code, field 0 */
    code=(uint32_t)uprv_strtoul(fields[0][0], &end, 16);
    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "gensprep: error parsing NormalizationCorrections.txt mapping at %s\n", fields[0][0]);
        exit(*pErrorCode);
    }
    /* Original (erroneous) decomposition */
    s = fields[1][0];

    /* parse the mapping string */
    length=u_parseCodePoints(s, mapping, sizeof(mapping)/4, pErrorCode);

    /* ignore corrected decomposition */

    u_versionFromString(version,fields[3][0] );
    u_versionFromString(thisVersion, "3.2.0");



    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "gensprep error parsing NormalizationCorrections.txt of U+%04lx - %s\n",
                (long)code, u_errorName(*pErrorCode));
        exit(*pErrorCode);
    }

    /* store the mapping */
    if( version[0] > thisVersion[0] || 
        ((version[0]==thisVersion[0]) && (version[1] > thisVersion[1]))
        ){
        storeMapping(code,mapping, length, USPREP_MAP, pErrorCode);
    }
    setUnicodeVersionNC(version);
}